

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNew
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayNew *curr)

{
  bool bVar1;
  Expression **ppEVar2;
  Type local_40;
  uintptr_t local_38;
  Type local_30 [2];
  uintptr_t local_20;
  ArrayNew *local_18;
  ArrayNew *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNew *)this;
  bVar1 = ArrayNew::isWithDefault(curr);
  if (!bVar1) {
    ppEVar2 = &local_18->init;
    local_38 = (uintptr_t)
               wasm::Type::getHeapType
                         (&(local_18->super_SpecificExpression<(wasm::Expression::Id)70>).
                           super_Expression.type);
    HeapType::getArray((HeapType *)local_30);
    local_20 = local_30[0].id;
    note(this,ppEVar2,local_30[0]);
  }
  ppEVar2 = &local_18->size;
  wasm::Type::Type(&local_40,i32);
  note(this,ppEVar2,local_40);
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    if (!curr->isWithDefault()) {
      note(&curr->init, curr->type.getHeapType().getArray().element.type);
    }
    note(&curr->size, Type::i32);
  }